

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O0

guint8 * p2sc_hex2bin(char *hex,size_t len)

{
  guint8 gVar1;
  byte bVar2;
  guint8 *pgVar3;
  ulong in_RSI;
  long in_RDI;
  size_t i;
  guint8 *bin;
  ulong local_20;
  
  pgVar3 = (guint8 *)g_malloc(in_RSI >> 1);
  for (local_20 = 0; local_20 < in_RSI >> 1; local_20 = local_20 + 1) {
    gVar1 = h2b(*(char *)(in_RDI + local_20 * 2));
    bVar2 = h2b(*(char *)(in_RDI + 1 + local_20 * 2));
    pgVar3[local_20] = gVar1 * '\x10' + (bVar2 & 0xf);
  }
  return pgVar3;
}

Assistant:

guint8 *p2sc_hex2bin(const char *hex, size_t len) {
    len /= 2;
    guint8 *bin = (guint8 *) g_malloc(len);

    for (size_t i = 0; i < len; ++i)
        bin[i] = (h2b(hex[2 * i]) << 4) + (h2b(hex[2 * i + 1]) & 0xf);

    return bin;
}